

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid_tools.cc
# Opt level: O3

void SampleGrids(int64_t limit)

{
  void *table;
  void *index;
  result_type_conflict rVar1;
  char grid [81];
  char acStack_88 [88];
  
  table = MMapFile("grid.counts");
  index = MMapFile("grid.index");
  if (limit != 0) {
    do {
      rVar1 = std::uniform_int_distribution<unsigned_long>::operator()
                        ((uniform_int_distribution<unsigned_long> *)
                         (anonymous_namespace)::random_uint,
                         (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                          *)(anonymous_namespace)::rng,
                         (param_type *)(anonymous_namespace)::random_uint);
      GetGrid(rVar1 % 0x339a6ca6180,index,table,acStack_88);
      printf("%.81s\t%zu\n",acStack_88,rVar1 % 0x339a6ca6180);
      limit = limit + -1;
    } while (limit != 0);
  }
  return;
}

Assistant:

void SampleGrids(int64_t limit) {
    void *table = MMapFile("grid.counts");
    void *index = MMapFile("grid.index");

    char grid[81];
    while (limit-- != 0) {
        size_t grid_id = random_uint(rng) % num_equivalence_classes;
        GetGrid(grid_id, index, table, grid);
        printf("%.81s\t%zu\n", grid, grid_id);
    }
}